

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::has_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  bool bVar1;
  Meta *pMVar2;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)type);
  if ((pMVar2 != (Meta *)0x0) &&
     ((ulong)index <
      (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size)) {
    bVar1 = Bitset::get(&(pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.
                         ptr[index].extended.flags,decoration);
    return bVar1;
  }
  return false;
}

Assistant:

bool Compiler::has_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return false;

	if (index >= m->members.size())
		return false;

	auto &dec = m->members[index];
	return dec.extended.flags.get(decoration);
}